

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_end_stream(Parser *this)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  code *pcVar4;
  size_t sVar5;
  Location LVar6;
  undefined1 auVar7 [24];
  Location LVar8;
  Location LVar9;
  Location LVar10;
  bool bVar11;
  NodeType NVar12;
  NodeData *n;
  size_t node;
  ulong uVar13;
  State *pSVar14;
  Tree *this_00;
  Tree *pTVar15;
  csubstr fmt;
  csubstr val;
  csubstr cVar16;
  char msg [34];
  char local_e8 [24];
  char *pcStack_d0;
  undefined8 local_c8;
  undefined3 uStack_c0;
  undefined5 uStack_bd;
  undefined3 uStack_b8;
  char acStack_b5 [21];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  if ((this->m_stack).m_size == 0) {
    builtin_strncpy(local_e8 + 0x10," m_stack",8);
    pcStack_d0 = (char *)0x29287974706d652e;
    builtin_strncpy(local_e8,"check failed: (!",0x10);
    local_c8._0_2_ = 0x29;
    if (((byte)s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_50 = 0;
    uStack_48 = 0x778f;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    auVar7 = ZEXT1224(ZEXT412(0x778f) << 0x40);
    LVar6.name.str._0_4_ = 0x2466fd;
    LVar6.super_LineCol.offset = auVar7._0_8_;
    LVar6.super_LineCol.line = auVar7._8_8_;
    LVar6.super_LineCol.col = auVar7._16_8_;
    LVar6.name.str._4_4_ = 0;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_e8,0x22,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar14 = this->m_state;
  if (((uint)pSVar14->flags >> 9 & 1) == 0) {
    if ((pSVar14->flags & 0x98U) == 0x88) {
      pcVar2 = (pSVar14->line_contents).rem.str;
      pcVar3 = (this->m_buf).str;
      if ((pcVar2 < pcVar3) || (pcVar3 + (this->m_buf).len < pcVar2)) {
        uStack_b8 = 0x667562;
        builtin_strncpy(acStack_b5,".end())",8);
        local_c8._0_1_ = 'n';
        local_c8._1_1_ = '(';
        local_c8._2_1_ = ')';
        local_c8._3_1_ = ' ';
        local_c8._4_1_ = '&';
        local_c8._5_1_ = '&';
        local_c8._6_1_ = ' ';
        local_c8._7_1_ = 's';
        uStack_c0 = 0x207274;
        uStack_bd = 0x5f6d203d3c;
        builtin_strncpy(local_e8 + 0x10,"tr >= m_",8);
        pcStack_d0 = (char *)0x696765622e667562;
        builtin_strncpy(local_e8,"check failed: (s",0x10);
        if (((byte)s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_a0 = 0;
        uStack_98 = 0x5e95;
        local_90 = 0;
        pcStack_88 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_80 = 0x65;
        auVar7 = ZEXT1224(ZEXT412(0x5e95) << 0x40);
        LVar8.name.str._0_4_ = 0x2466fd;
        LVar8.super_LineCol.offset = auVar7._0_8_;
        LVar8.super_LineCol.line = auVar7._8_8_;
        LVar8.super_LineCol.col = auVar7._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_e8,0x3b,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
      cVar16 = (csubstr)ZEXT816(0);
LAB_002145d3:
      n = _append_val(this,cVar16,0);
    }
    else {
      if (((this->m_val_tag).len == 0) || ((this->m_val_tag).str == (char *)0x0)) goto LAB_0021480b;
      pTVar15 = this->m_tree;
      uVar13 = pSVar14->node_id;
      if ((uVar13 == 0xffffffffffffffff) || (this_00 = pTVar15, pTVar15->m_cap <= uVar13)) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_e8[0] = '\0';
        local_e8[1] = '\0';
        local_e8[2] = '\0';
        local_e8[3] = '\0';
        local_e8[4] = '\0';
        local_e8[5] = '\0';
        local_e8[6] = '\0';
        local_e8[7] = '\0';
        local_e8[8] = -0x7a;
        local_e8[9] = 'K';
        local_e8[10] = '\0';
        local_e8[0xb] = '\0';
        local_e8[0xc] = '\0';
        local_e8[0xd] = '\0';
        local_e8[0xe] = '\0';
        local_e8[0xf] = '\0';
        local_e8[0x10] = '\0';
        local_e8[0x11] = '\0';
        local_e8[0x12] = '\0';
        local_e8[0x13] = '\0';
        local_e8[0x14] = '\0';
        local_e8[0x15] = '\0';
        local_e8[0x16] = '\0';
        local_e8[0x17] = '\0';
        pcStack_d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_c8._0_1_ = 'e';
        local_c8._1_1_ = '\0';
        local_c8._2_1_ = '\0';
        local_c8._3_1_ = '\0';
        local_c8._4_1_ = '\0';
        local_c8._5_1_ = '\0';
        local_c8._6_1_ = '\0';
        local_c8._7_1_ = '\0';
        (*(code *)PTR_error_impl_00297798)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pSVar14 = this->m_state;
        this_00 = this->m_tree;
      }
      if ((pTVar15->m_buf[uVar13].m_type.type & DOC) == NOTYPE) {
        NVar12 = Tree::type(this_00,pSVar14->node_id);
        if (NVar12.type != NOTYPE) goto LAB_0021480b;
        pSVar14 = this->m_state;
        this_00 = this->m_tree;
      }
      val.len = 0;
      val.str = (pSVar14->line_contents).rem.str;
      Tree::to_val(this_00,pSVar14->node_id,val,0x10);
      uVar13 = this->m_state->node_id;
      if (uVar13 == 0xffffffffffffffff) goto LAB_0021480b;
      pTVar15 = this->m_tree;
      if (pTVar15->m_cap <= uVar13) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
LAB_00214a9f:
        local_e8[0] = '\0';
        local_e8[1] = '\0';
        local_e8[2] = '\0';
        local_e8[3] = '\0';
        local_e8[4] = '\0';
        local_e8[5] = '\0';
        local_e8[6] = '\0';
        local_e8[7] = '\0';
        local_e8[8] = 't';
        local_e8[9] = 'K';
        local_e8[10] = '\0';
        local_e8[0xb] = '\0';
        local_e8[0xc] = '\0';
        local_e8[0xd] = '\0';
        local_e8[0xe] = '\0';
        local_e8[0xf] = '\0';
        local_e8[0x10] = '\0';
        local_e8[0x11] = '\0';
        local_e8[0x12] = '\0';
        local_e8[0x13] = '\0';
        local_e8[0x14] = '\0';
        local_e8[0x15] = '\0';
        local_e8[0x16] = '\0';
        local_e8[0x17] = '\0';
        pcStack_d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_c8._0_1_ = 'e';
        local_c8._1_1_ = '\0';
        local_c8._2_1_ = '\0';
        local_c8._3_1_ = '\0';
        local_c8._4_1_ = '\0';
        local_c8._5_1_ = '\0';
        local_c8._6_1_ = '\0';
        local_c8._7_1_ = '\0';
        (*(code *)PTR_error_impl_00297798)
                  ("check failed: i >= 0 && i < m_cap",0x21,
                   (anonymous_namespace)::s_default_callbacks);
      }
LAB_00214aff:
      n = pTVar15->m_buf + uVar13;
    }
  }
  else {
    pTVar15 = this->m_tree;
    uVar13 = pSVar14->node_id;
    if ((uVar13 == 0xffffffffffffffff) || (pTVar15->m_cap <= uVar13)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_e8[0] = '\0';
      local_e8[1] = '\0';
      local_e8[2] = '\0';
      local_e8[3] = '\0';
      local_e8[4] = '\0';
      local_e8[5] = '\0';
      local_e8[6] = '\0';
      local_e8[7] = '\0';
      local_e8[8] = -0x7a;
      local_e8[9] = 'K';
      local_e8[10] = '\0';
      local_e8[0xb] = '\0';
      local_e8[0xc] = '\0';
      local_e8[0xd] = '\0';
      local_e8[0xe] = '\0';
      local_e8[0xf] = '\0';
      local_e8[0x10] = '\0';
      local_e8[0x11] = '\0';
      local_e8[0x12] = '\0';
      local_e8[0x13] = '\0';
      local_e8[0x14] = '\0';
      local_e8[0x15] = '\0';
      local_e8[0x16] = '\0';
      local_e8[0x17] = '\0';
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8._0_1_ = 'e';
      local_c8._1_1_ = '\0';
      local_c8._2_1_ = '\0';
      local_c8._3_1_ = '\0';
      local_c8._4_1_ = '\0';
      local_c8._5_1_ = '\0';
      local_c8._6_1_ = '\0';
      local_c8._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar15->m_buf[uVar13].m_type.type & SEQ) != NOTYPE) {
      cVar16 = _consume_scalar(this);
      goto LAB_002145d3;
    }
    pTVar15 = this->m_tree;
    uVar13 = this->m_state->node_id;
    if ((uVar13 == 0xffffffffffffffff) || (pTVar15->m_cap <= uVar13)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_e8[0] = '\0';
      local_e8[1] = '\0';
      local_e8[2] = '\0';
      local_e8[3] = '\0';
      local_e8[4] = '\0';
      local_e8[5] = '\0';
      local_e8[6] = '\0';
      local_e8[7] = '\0';
      local_e8[8] = -0x7a;
      local_e8[9] = 'K';
      local_e8[10] = '\0';
      local_e8[0xb] = '\0';
      local_e8[0xc] = '\0';
      local_e8[0xd] = '\0';
      local_e8[0xe] = '\0';
      local_e8[0xf] = '\0';
      local_e8[0x10] = '\0';
      local_e8[0x11] = '\0';
      local_e8[0x12] = '\0';
      local_e8[0x13] = '\0';
      local_e8[0x14] = '\0';
      local_e8[0x15] = '\0';
      local_e8[0x16] = '\0';
      local_e8[0x17] = '\0';
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8._0_1_ = 'e';
      local_c8._1_1_ = '\0';
      local_c8._2_1_ = '\0';
      local_c8._3_1_ = '\0';
      local_c8._4_1_ = '\0';
      local_c8._5_1_ = '\0';
      local_c8._6_1_ = '\0';
      local_c8._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar15->m_buf[uVar13].m_type.type & MAP) == NOTYPE) {
      pTVar15 = this->m_tree;
      pSVar14 = this->m_state;
      uVar13 = pSVar14->node_id;
      if ((uVar13 == 0xffffffffffffffff) || (pTVar15->m_cap <= uVar13)) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_e8[0] = '\0';
        local_e8[1] = '\0';
        local_e8[2] = '\0';
        local_e8[3] = '\0';
        local_e8[4] = '\0';
        local_e8[5] = '\0';
        local_e8[6] = '\0';
        local_e8[7] = '\0';
        local_e8[8] = -0x7a;
        local_e8[9] = 'K';
        local_e8[10] = '\0';
        local_e8[0xb] = '\0';
        local_e8[0xc] = '\0';
        local_e8[0xd] = '\0';
        local_e8[0xe] = '\0';
        local_e8[0xf] = '\0';
        local_e8[0x10] = '\0';
        local_e8[0x11] = '\0';
        local_e8[0x12] = '\0';
        local_e8[0x13] = '\0';
        local_e8[0x14] = '\0';
        local_e8[0x15] = '\0';
        local_e8[0x16] = '\0';
        local_e8[0x17] = '\0';
        pcStack_d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_c8._0_1_ = 'e';
        local_c8._1_1_ = '\0';
        local_c8._2_1_ = '\0';
        local_c8._3_1_ = '\0';
        local_c8._4_1_ = '\0';
        local_c8._5_1_ = '\0';
        local_c8._6_1_ = '\0';
        local_c8._7_1_ = '\0';
        (*(code *)PTR_error_impl_00297798)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        pSVar14 = this->m_state;
      }
      if ((pTVar15->m_buf[uVar13].m_type.type & DOC) == NOTYPE) {
        NVar12 = Tree::type(this->m_tree,pSVar14->node_id);
        if (NVar12.type != NOTYPE) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            bVar11 = is_debugger_attached();
            if (bVar11) {
              pcVar4 = (code *)swi(3);
              (*pcVar4)();
              return;
            }
          }
          cVar16.len = 0x15;
          cVar16.str = "ERROR: internal error";
          _err<>(this,cVar16);
          goto LAB_0021480b;
        }
        pSVar14 = this->m_state;
      }
      uVar1 = pSVar14->flags;
      cVar16 = _consume_scalar(this);
      Tree::to_val(this->m_tree,this->m_state->node_id,cVar16,(ulong)(uVar1 & 0x400) * 4 + 0x10);
      uVar13 = this->m_state->node_id;
      if (uVar13 == 0xffffffffffffffff) goto LAB_0021480b;
      pTVar15 = this->m_tree;
      if (pTVar15->m_cap <= uVar13) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        goto LAB_00214a9f;
      }
      goto LAB_00214aff;
    }
    pcVar2 = (this->m_state->line_contents).rem.str;
    pcVar3 = (this->m_buf).str;
    if ((pcVar2 < pcVar3) || (pcVar3 + (this->m_buf).len < pcVar2)) {
      uStack_b8 = 0x667562;
      builtin_strncpy(acStack_b5,".end())",8);
      local_c8._0_1_ = 'n';
      local_c8._1_1_ = '(';
      local_c8._2_1_ = ')';
      local_c8._3_1_ = ' ';
      local_c8._4_1_ = '&';
      local_c8._5_1_ = '&';
      local_c8._6_1_ = ' ';
      local_c8._7_1_ = 's';
      uStack_c0 = 0x207274;
      uStack_bd = 0x5f6d203d3c;
      builtin_strncpy(local_e8 + 0x10,"tr >= m_",8);
      pcStack_d0 = (char *)0x696765622e667562;
      builtin_strncpy(local_e8,"check failed: (s",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_a0 = 0;
      uStack_98 = 0x5e96;
      local_90 = 0;
      pcStack_88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_80 = 0x65;
      auVar7 = ZEXT1224(ZEXT412(0x5e96) << 0x40);
      LVar10.name.str._0_4_ = 0x2466fd;
      LVar10.super_LineCol.offset = auVar7._0_8_;
      LVar10.super_LineCol.line = auVar7._8_8_;
      LVar10.super_LineCol.col = auVar7._16_8_;
      LVar10.name.str._4_4_ = 0;
      LVar10.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_e8,0x3b,LVar10,(this->m_stack).m_callbacks.m_user_data);
    }
    n = _append_key_val(this,(csubstr)ZEXT816(0),0);
  }
  if (n == (NodeData *)0x0) goto LAB_0021480b;
  node = Tree::id(this->m_tree,n);
  pTVar15 = this->m_tree;
  uVar13 = this->m_state->node_id;
  if ((uVar13 == 0xffffffffffffffff) || (pTVar15->m_cap <= uVar13)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_e8[0] = '\0';
    local_e8[1] = '\0';
    local_e8[2] = '\0';
    local_e8[3] = '\0';
    local_e8[4] = '\0';
    local_e8[5] = '\0';
    local_e8[6] = '\0';
    local_e8[7] = '\0';
    local_e8[8] = -0x7a;
    local_e8[9] = 'K';
    local_e8[10] = '\0';
    local_e8[0xb] = '\0';
    local_e8[0xc] = '\0';
    local_e8[0xd] = '\0';
    local_e8[0xe] = '\0';
    local_e8[0xf] = '\0';
    local_e8[0x10] = '\0';
    local_e8[0x11] = '\0';
    local_e8[0x12] = '\0';
    local_e8[0x13] = '\0';
    local_e8[0x14] = '\0';
    local_e8[0x15] = '\0';
    local_e8[0x16] = '\0';
    local_e8[0x17] = '\0';
    pcStack_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_c8._0_1_ = 'e';
    local_c8._1_1_ = '\0';
    local_c8._2_1_ = '\0';
    local_c8._3_1_ = '\0';
    local_c8._4_1_ = '\0';
    local_c8._5_1_ = '\0';
    local_c8._6_1_ = '\0';
    local_c8._7_1_ = '\0';
    (*(code *)PTR_error_impl_00297798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar15->m_buf[uVar13].m_type.type & SEQ) == NOTYPE) {
    pTVar15 = this->m_tree;
    uVar13 = this->m_state->node_id;
    if ((uVar13 == 0xffffffffffffffff) || (pTVar15->m_cap <= uVar13)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_e8[0] = '\0';
      local_e8[1] = '\0';
      local_e8[2] = '\0';
      local_e8[3] = '\0';
      local_e8[4] = '\0';
      local_e8[5] = '\0';
      local_e8[6] = '\0';
      local_e8[7] = '\0';
      local_e8[8] = -0x7a;
      local_e8[9] = 'K';
      local_e8[10] = '\0';
      local_e8[0xb] = '\0';
      local_e8[0xc] = '\0';
      local_e8[0xd] = '\0';
      local_e8[0xe] = '\0';
      local_e8[0xf] = '\0';
      local_e8[0x10] = '\0';
      local_e8[0x11] = '\0';
      local_e8[0x12] = '\0';
      local_e8[0x13] = '\0';
      local_e8[0x14] = '\0';
      local_e8[0x15] = '\0';
      local_e8[0x16] = '\0';
      local_e8[0x17] = '\0';
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8._0_1_ = 'e';
      local_c8._1_1_ = '\0';
      local_c8._2_1_ = '\0';
      local_c8._3_1_ = '\0';
      local_c8._4_1_ = '\0';
      local_c8._5_1_ = '\0';
      local_c8._6_1_ = '\0';
      local_c8._7_1_ = '\0';
      (*(code *)PTR_error_impl_00297798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar15->m_buf[uVar13].m_type.type & DOC) != NOTYPE) goto LAB_00214734;
  }
  else {
LAB_00214734:
    if (((this->m_key_anchor).len != 0) && ((this->m_key_anchor).str != (char *)0x0)) {
      sVar5 = (this->m_key_anchor).len;
      (this->m_val_anchor).str = (this->m_key_anchor).str;
      (this->m_val_anchor).len = sVar5;
      (this->m_key_anchor).str = (char *)0x0;
      (this->m_key_anchor).len = 0;
    }
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      sVar5 = (this->m_key_tag).len;
      (this->m_val_tag).str = (this->m_key_tag).str;
      (this->m_val_tag).len = sVar5;
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
    }
  }
  if ((this->m_val_anchor).str != (char *)0x0 && (this->m_val_anchor).len != 0) {
    Tree::set_val_anchor(this->m_tree,node,this->m_val_anchor);
    (this->m_val_anchor).str = (char *)0x0;
    (this->m_val_anchor).len = 0;
  }
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar15 = this->m_tree;
    cVar16 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(pTVar15,node,cVar16);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
LAB_0021480b:
  uVar13 = (this->m_stack).m_size;
  if (1 < uVar13) {
    do {
      if (((this->m_stack).m_stack[uVar13 - 1].flags & 0x200) != 0) {
        local_c8._0_1_ = 'm';
        local_c8._1_1_ = '_';
        local_c8._2_1_ = 's';
        local_c8._3_1_ = 't';
        local_c8._4_1_ = 'a';
        local_c8._5_1_ = 'c';
        local_c8._6_1_ = 'k';
        local_c8._7_1_ = '.';
        uStack_c0 = 0x706f74;
        uStack_bd = 0x29292928;
        builtin_strncpy(local_e8 + 0x10," has_any",8);
        pcStack_d0 = (char *)0x26202c4c43535328;
        builtin_strncpy(local_e8,"check failed: (!",0x10);
        if (((byte)s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_78 = 0;
        uStack_70 = 0x77f1;
        local_68 = 0;
        pcStack_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_58 = 0x65;
        auVar7 = ZEXT1224(ZEXT412(0x77f1) << 0x40);
        LVar9.name.str._0_4_ = 0x2466fd;
        LVar9.super_LineCol.offset = auVar7._0_8_;
        LVar9.super_LineCol.line = auVar7._8_8_;
        LVar9.super_LineCol.col = auVar7._16_8_;
        LVar9.name.str._4_4_ = 0;
        LVar9.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_e8,0x30,LVar9,(this->m_stack).m_callbacks.m_user_data);
      }
      if ((~this->m_state->flags & 0x18U) == 0) {
        fmt.len = 0x13;
        fmt.str = "closing ] not found";
        _err<>(this,fmt);
      }
      _pop_level(this);
      uVar13 = (this->m_stack).m_size;
    } while (1 < uVar13);
  }
  this->m_state->flags = this->m_state->flags | 0x1000;
  return;
}

Assistant:

void Parser::_end_stream()
{
    _c4dbgpf("end_stream, level={} node_id={}", m_state->level, m_state->node_id);
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! m_stack.empty());
    NodeData *added = nullptr;
    if(has_any(SSCL))
    {
        if(m_tree->is_seq(m_state->node_id))
        {
            _c4dbgp("append val...");
            added = _append_val(_consume_scalar());
        }
        else if(m_tree->is_map(m_state->node_id))
        {
            _c4dbgp("append null key val...");
            added = _append_key_val_null(m_state->line_contents.rem.str);
            #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
            if(has_any(RSEQIMAP))
            {
                _stop_seqimap();
                _pop_level();
            }
            #endif
        }
        else if(m_tree->is_doc(m_state->node_id) || m_tree->type(m_state->node_id) == NOTYPE)
        {
            NodeType_e quoted = has_any(QSCL) ? VALQUO : NOTYPE; // do this before consuming the scalar
            csubstr scalar = _consume_scalar();
            _c4dbgpf("node[{}]: to docval '{}'{}", m_state->node_id, scalar, quoted == VALQUO ? ", quoted" : "");
            m_tree->to_val(m_state->node_id, scalar, DOC|quoted);
            added = m_tree->get(m_state->node_id);
        }
        else
        {
            _c4err("internal error");
        }
    }
    else if(has_all(RSEQ|RVAL) && has_none(FLOW))
    {
        _c4dbgp("add last...");
        added = _append_val_null(m_state->line_contents.rem.str);
    }
    else if(!m_val_tag.empty() && (m_tree->is_doc(m_state->node_id) || m_tree->type(m_state->node_id) == NOTYPE))
    {
        csubstr scalar = m_state->line_contents.rem.first(0);
        _c4dbgpf("node[{}]: add null scalar as docval", m_state->node_id);
        m_tree->to_val(m_state->node_id, scalar, DOC);
        added = m_tree->get(m_state->node_id);
    }

    if(added)
    {
        size_t added_id = m_tree->id(added);
        if(m_tree->is_seq(m_state->node_id) || m_tree->is_doc(m_state->node_id))
        {
            if(!m_key_anchor.empty())
            {
                _c4dbgpf("node[{}]: move key to val anchor: '{}'", added_id, m_key_anchor);
                m_val_anchor = m_key_anchor;
                m_key_anchor = {};
            }
            if(!m_key_tag.empty())
            {
                _c4dbgpf("node[{}]: move key to val tag: '{}'", added_id, m_key_tag);
                m_val_tag = m_key_tag;
                m_key_tag = {};
            }
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(!m_key_anchor.empty())
        {
            _c4dbgpf("node[{}]: set key anchor='{}'", added_id, m_key_anchor);
            m_tree->set_key_anchor(added_id, m_key_anchor);
            m_key_anchor = {};
        }
        #endif
        if(!m_val_anchor.empty())
        {
            _c4dbgpf("node[{}]: set val anchor='{}'", added_id, m_val_anchor);
            m_tree->set_val_anchor(added_id, m_val_anchor);
            m_val_anchor = {};
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(!m_key_tag.empty())
        {
            _c4dbgpf("node[{}]: set key tag='{}' -> '{}'", added_id, m_key_tag, normalize_tag(m_key_tag));
            m_tree->set_key_tag(added_id, normalize_tag(m_key_tag));
            m_key_tag = {};
        }
        #endif
        if(!m_val_tag.empty())
        {
            _c4dbgpf("node[{}]: set val tag='{}' -> '{}'", added_id, m_val_tag, normalize_tag(m_val_tag));
            m_tree->set_val_tag(added_id, normalize_tag(m_val_tag));
            m_val_tag = {};
        }
    }

    while(m_stack.size() > 1)
    {
        _c4dbgpf("popping level: {} (stack sz={})", m_state->level, m_stack.size());
        _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_any(SSCL, &m_stack.top()));
        if(has_all(RSEQ|FLOW))
            _err("closing ] not found");
        _pop_level();
    }
    add_flags(NDOC);
}